

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O2

void rw::buildPlanes(Camera *cam)

{
  V3d *pVVar1;
  V3d *pVVar2;
  V3d *b;
  float32 *pfVar3;
  Matrix *pMVar4;
  float32 fVar5;
  V3d VVar6;
  V3d local_88;
  V3d local_78;
  V3d *local_68;
  V3d *local_60;
  V3d *local_58;
  V3d local_50;
  V3d local_40;
  
  pVVar1 = cam->frustumCorners + 1;
  pVVar2 = cam->frustumCorners + 5;
  local_50 = sub(pVVar1,pVVar2);
  local_58 = cam->frustumCorners + 3;
  local_60 = cam->frustumCorners + 7;
  local_40 = sub(local_58,local_60);
  pMVar4 = Frame::getLTM((Frame *)(cam->object).object.parent);
  fVar5 = (pMVar4->at).y;
  cam->frustumPlanes[0].plane.normal.x = (pMVar4->at).x;
  cam->frustumPlanes[0].plane.normal.y = fVar5;
  cam->frustumPlanes[0].plane.normal.z = (pMVar4->at).z;
  b = cam->frustumCorners + 4;
  fVar5 = dot((V3d *)cam->frustumPlanes,b);
  cam->frustumPlanes[0].plane.distance = fVar5;
  cam->frustumPlanes[0].closestX =
       0.0 < (float)cam->frustumPlanes[0].plane.normal.x ||
       (float)cam->frustumPlanes[0].plane.normal.x == 0.0;
  pfVar3 = &cam->frustumPlanes[0].plane.normal.y;
  cam->frustumPlanes[0].closestY = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  pfVar3 = &cam->frustumPlanes[0].plane.normal.z;
  cam->frustumPlanes[0].closestZ = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  VVar6 = neg((V3d *)cam->frustumPlanes);
  *(V3d *)(cam->frustumPlanes + 1) = VVar6;
  fVar5 = dot((V3d *)(cam->frustumPlanes + 1),cam->frustumCorners);
  cam->frustumPlanes[1].plane.distance = fVar5;
  cam->frustumPlanes[1].closestX =
       0.0 < (float)cam->frustumPlanes[1].plane.normal.x ||
       (float)cam->frustumPlanes[1].plane.normal.x == 0.0;
  pfVar3 = &cam->frustumPlanes[1].plane.normal.y;
  cam->frustumPlanes[1].closestY = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  pfVar3 = &cam->frustumPlanes[1].plane.normal.z;
  cam->frustumPlanes[1].closestZ = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  local_68 = cam->frustumCorners + 6;
  local_88 = sub(local_68,pVVar2);
  local_78 = cross(&local_50,&local_88);
  VVar6 = normalize(&local_78);
  *(V3d *)(cam->frustumPlanes + 2) = VVar6;
  fVar5 = dot((V3d *)(cam->frustumPlanes + 2),pVVar1);
  cam->frustumPlanes[2].plane.distance = fVar5;
  cam->frustumPlanes[2].closestX =
       0.0 < (float)cam->frustumPlanes[2].plane.normal.x ||
       (float)cam->frustumPlanes[2].plane.normal.x == 0.0;
  pfVar3 = &cam->frustumPlanes[2].plane.normal.y;
  cam->frustumPlanes[2].closestY = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  pfVar3 = &cam->frustumPlanes[2].plane.normal.z;
  cam->frustumPlanes[2].closestZ = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  local_88 = sub(b,pVVar2);
  local_78 = cross(&local_88,&local_50);
  VVar6 = normalize(&local_78);
  *(V3d *)(cam->frustumPlanes + 3) = VVar6;
  fVar5 = dot((V3d *)(cam->frustumPlanes + 3),pVVar1);
  pVVar1 = local_60;
  cam->frustumPlanes[3].plane.distance = fVar5;
  cam->frustumPlanes[3].closestX =
       0.0 < (float)cam->frustumPlanes[3].plane.normal.x ||
       (float)cam->frustumPlanes[3].plane.normal.x == 0.0;
  pfVar3 = &cam->frustumPlanes[3].plane.normal.y;
  cam->frustumPlanes[3].closestY = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  pfVar3 = &cam->frustumPlanes[3].plane.normal.z;
  cam->frustumPlanes[3].closestZ = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  local_88 = sub(b,local_60);
  local_78 = cross(&local_40,&local_88);
  VVar6 = normalize(&local_78);
  pVVar2 = local_58;
  *(V3d *)(cam->frustumPlanes + 4) = VVar6;
  fVar5 = dot((V3d *)(cam->frustumPlanes + 4),local_58);
  cam->frustumPlanes[4].plane.distance = fVar5;
  cam->frustumPlanes[4].closestX =
       0.0 < (float)cam->frustumPlanes[4].plane.normal.x ||
       (float)cam->frustumPlanes[4].plane.normal.x == 0.0;
  pfVar3 = &cam->frustumPlanes[4].plane.normal.y;
  cam->frustumPlanes[4].closestY = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  pfVar3 = &cam->frustumPlanes[4].plane.normal.z;
  cam->frustumPlanes[4].closestZ = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  local_88 = sub(local_68,pVVar1);
  local_78 = cross(&local_88,&local_40);
  VVar6 = normalize(&local_78);
  *(V3d *)(cam->frustumPlanes + 5) = VVar6;
  fVar5 = dot((V3d *)(cam->frustumPlanes + 5),pVVar2);
  cam->frustumPlanes[5].plane.distance = fVar5;
  cam->frustumPlanes[5].closestX =
       0.0 < (float)cam->frustumPlanes[5].plane.normal.x ||
       (float)cam->frustumPlanes[5].plane.normal.x == 0.0;
  pfVar3 = &cam->frustumPlanes[5].plane.normal.y;
  cam->frustumPlanes[5].closestY = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  pfVar3 = &cam->frustumPlanes[5].plane.normal.z;
  cam->frustumPlanes[5].closestZ = 0.0 < (float)*pfVar3 || (float)*pfVar3 == 0.0;
  return;
}

Assistant:

static void
buildPlanes(Camera *cam)
{
	V3d *c = cam->frustumCorners;
	FrustumPlane *p = cam->frustumPlanes;
	V3d v51 = sub(c[1], c[5]);
	V3d v73 = sub(c[3], c[7]);

	/* Far plane */
	p[0].plane.normal = cam->getFrame()->getLTM()->at;
	p[0].plane.distance = dot(p[0].plane.normal, c[4]);
	p[0].closestX = p[0].plane.normal.x < 0.0f ? 0 : 1;
	p[0].closestY = p[0].plane.normal.y < 0.0f ? 0 : 1;
	p[0].closestZ = p[0].plane.normal.z < 0.0f ? 0 : 1;

	/* Near plane */
	p[1].plane.normal = neg(p[0].plane.normal);
	p[1].plane.distance = dot(p[1].plane.normal, c[0]);
	p[1].closestX = p[1].plane.normal.x < 0.0f ? 0 : 1;
	p[1].closestY = p[1].plane.normal.y < 0.0f ? 0 : 1;
	p[1].closestZ = p[1].plane.normal.z < 0.0f ? 0 : 1;

	/* Right plane */
	p[2].plane.normal = normalize(cross(v51,
	                                    sub(c[6], c[5])));
	p[2].plane.distance = dot(p[2].plane.normal, c[1]);
	p[2].closestX = p[2].plane.normal.x < 0.0f ? 0 : 1;
	p[2].closestY = p[2].plane.normal.y < 0.0f ? 0 : 1;
	p[2].closestZ = p[2].plane.normal.z < 0.0f ? 0 : 1;

	/* Top plane */
	p[3].plane.normal = normalize(cross(sub(c[4], c[5]),
	                                    v51));
	p[3].plane.distance = dot(p[3].plane.normal, c[1]);
	p[3].closestX = p[3].plane.normal.x < 0.0f ? 0 : 1;
	p[3].closestY = p[3].plane.normal.y < 0.0f ? 0 : 1;
	p[3].closestZ = p[3].plane.normal.z < 0.0f ? 0 : 1;

	/* Left plane */
	p[4].plane.normal = normalize(cross(v73,
	                                    sub(c[4], c[7])));
	p[4].plane.distance = dot(p[4].plane.normal, c[3]);
	p[4].closestX = p[4].plane.normal.x < 0.0f ? 0 : 1;
	p[4].closestY = p[4].plane.normal.y < 0.0f ? 0 : 1;
	p[4].closestZ = p[4].plane.normal.z < 0.0f ? 0 : 1;

	/* Bottom plane */
	p[5].plane.normal = normalize(cross(sub(c[6], c[7]),
	                                    v73));
	p[5].plane.distance = dot(p[5].plane.normal, c[3]);
	p[5].closestX = p[5].plane.normal.x < 0.0f ? 0 : 1;
	p[5].closestY = p[5].plane.normal.y < 0.0f ? 0 : 1;
	p[5].closestZ = p[5].plane.normal.z < 0.0f ? 0 : 1;
}